

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warfare_Header.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Warfare_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Warfare_Header *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KUINT16 Tabs_01;
  KUINT16 Tabs_02;
  KStringStream ss;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Firing Entity ID:\n",0x12);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1c0,&this->m_FiringEntityID);
  UTILS::IndentString(&local_240,&local_1c0,Tabs,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Target Entity ID:\n",0x12);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1e0,&this->m_TargetEntityID);
  UTILS::IndentString(&local_260,&local_1e0,Tabs_00,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_260._M_dataplus._M_p,local_260._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Munition ID:\n",0xd);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_200,&this->m_MunitionID);
  UTILS::IndentString(&local_280,&local_200,Tabs_01,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Event ID:\n",10);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_220,&this->m_EventID);
  UTILS::IndentString(&local_2a0,&local_220,Tabs_02,in_CL);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Warfare_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Firing Entity ID:\n"
       << IndentString( m_FiringEntityID.GetAsString(), 1 )
       << "Target Entity ID:\n"
       << IndentString( m_TargetEntityID.GetAsString(), 1 )
       << "Munition ID:\n"
       << IndentString( m_MunitionID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 );

    return ss.str();
}